

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utypes.h
# Opt level: O1

UTrie2 * utrie2_fromUTrie_63(UTrie *trie1,uint32_t errorValue,UErrorCode *pErrorCode)

{
  uint32_t value;
  uint uVar1;
  uint c;
  NewTrieAndStatus context;
  UTrie2 *local_30;
  UErrorCode local_28;
  undefined1 local_24;
  
  if (U_ZERO_ERROR < *pErrorCode) {
    return (UTrie2 *)0x0;
  }
  if (trie1 == (UTrie *)0x0) {
    *pErrorCode = U_ILLEGAL_ARGUMENT_ERROR;
  }
  else {
    local_30 = utrie2_open_63(trie1->initialValue,errorValue,pErrorCode);
    local_28 = *pErrorCode;
    if (local_28 < U_ILLEGAL_ARGUMENT_ERROR) {
      local_24 = 1;
      utrie_enum_63(trie1,(undefined1 *)0x0,copyEnumRange,&local_30);
      *pErrorCode = local_28;
      c = 0xd800;
      do {
        uVar1 = (c & 0x1f) + (uint)trie1->index[c >> 5] * 4;
        if (trie1->data32 == (uint32_t *)0x0) {
          value = (uint32_t)trie1->index[uVar1];
        }
        else {
          value = trie1->data32[uVar1];
        }
        if ((value != trie1->initialValue) && (*pErrorCode < U_ILLEGAL_ARGUMENT_ERROR)) {
          if ((c & 0xfc00) == 0xd800) {
            set32(local_30->newTrie,c,'\0',value,pErrorCode);
          }
          else {
            *pErrorCode = U_ILLEGAL_ARGUMENT_ERROR;
          }
        }
        c = c + 1;
      } while (c != 0xdc00);
      if (*pErrorCode < U_ILLEGAL_ARGUMENT_ERROR) {
        utrie2_freeze_63(local_30,(uint)(trie1->data32 != (uint32_t *)0x0),pErrorCode);
      }
      if (*pErrorCode < U_ILLEGAL_ARGUMENT_ERROR) {
        return local_30;
      }
      utrie2_close_63(local_30);
      return (UTrie2 *)0x0;
    }
  }
  return (UTrie2 *)0x0;
}

Assistant:

static
    inline UBool U_FAILURE(UErrorCode code) { return (UBool)(code>U_ZERO_ERROR); }